

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.cpp
# Opt level: O0

string * format_abi_cxx11_(string *__return_storage_ptr__,char *fmt,...)

{
  char in_AL;
  size_type __n;
  char *__s;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined4 in_XMM0_Da;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_128 [16];
  undefined8 local_118;
  undefined8 local_110;
  undefined8 local_108;
  undefined8 local_100;
  undefined4 local_f8;
  undefined8 local_e8;
  undefined8 local_d8;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  allocator<char> local_5e;
  undefined1 local_5d;
  int local_5c;
  undefined8 uStack_58;
  int len;
  va_list args_len;
  undefined4 uStack_38;
  undefined4 uStack_34;
  va_list args;
  char *fmt_local;
  string *ret;
  
  if (in_AL != '\0') {
    local_f8 = in_XMM0_Da;
    local_e8 = in_XMM1_Qa;
    local_d8 = in_XMM2_Qa;
    local_c8 = in_XMM3_Qa;
    local_b8 = in_XMM4_Qa;
    local_a8 = in_XMM5_Qa;
    local_98 = in_XMM6_Qa;
    local_88 = in_XMM7_Qa;
  }
  args_len[0].overflow_arg_area = local_128;
  args_len[0]._0_8_ = &stack0x00000008;
  uStack_34 = 0x30;
  uStack_38 = 0x10;
  uStack_58 = 0x3000000010;
  local_118 = in_RDX;
  local_110 = in_RCX;
  local_108 = in_R8;
  local_100 = in_R9;
  args[0]._0_8_ = args_len[0]._0_8_;
  args[0].overflow_arg_area = args_len[0].overflow_arg_area;
  local_5c = vsnprintf((char *)0x0,0,fmt,&stack0xffffffffffffffa8);
  local_5d = 0;
  __n = (size_type)local_5c;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,__n,' ',&local_5e);
  std::allocator<char>::~allocator(&local_5e);
  __s = (char *)std::__cxx11::string::front();
  vsnprintf(__s,(long)(local_5c + 1),fmt,&uStack_38);
  return __return_storage_ptr__;
}

Assistant:

std::string format(const char* fmt, ...) {
	va_list args, args_len;
	va_start(args, fmt);
	va_copy(args_len, args);
	const int len = vsnprintf(nullptr, 0, fmt, args_len);
	va_end(args_len);

	std::string ret = std::string(len, ' ');
	vsnprintf(&ret.front(), len + 1, fmt, args);
	va_end(args);

	return ret;
}